

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

size_t __thiscall jrtplib::RTCPCompoundPacketBuilder::Report::NeededBytes(Report *this)

{
  size_type sVar1;
  size_t r;
  size_t d;
  size_t n;
  size_t x;
  Report *this_local;
  
  sVar1 = std::__cxx11::
          list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
          ::size(&this->reportblocks);
  if (sVar1 == 0) {
    if (this->headerlength == 0) {
      return 0;
    }
    n = this->headerlength + 4;
  }
  else {
    r = sVar1 / 0x1f;
    if (sVar1 % 0x1f != 0) {
      r = r + 1;
    }
    n = r * 8 + sVar1 * 0x18;
    if ((this->isSR & 1U) != 0) {
      n = n + 0x14;
    }
  }
  return n;
}

Assistant:

size_t NeededBytes() 
		{ 
			size_t x,n,d,r; 
			n = reportblocks.size(); 
			if (n == 0)
			{
				if (headerlength == 0)
					return 0;
				x = sizeof(RTCPCommonHeader)+headerlength;
			}
			else
			{
				x = n*sizeof(RTCPReceiverReport);
				d = n/31; // max 31 reportblocks per report
				r = n%31;
				if (r != 0)
					d++;
				x += d*(sizeof(RTCPCommonHeader)+sizeof(uint32_t)); /* header and SSRC */
				if (isSR)
					x += sizeof(RTCPSenderReport);
			}
			return x;
		}